

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_avx2.c
# Opt level: O2

int av1_apply_selfguided_restoration_avx2
              (uint8_t *dat8,int width,int height,int stride,int eps,int *xqd,uint8_t *dst8,
              int dst_stride,int32_t *tmpbuf,int bit_depth,int highbd)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined1 (*pauVar3) [16];
  long lVar4;
  undefined1 (*pauVar5) [32];
  ulong uVar6;
  undefined1 (*pauVar7) [16];
  ulong uVar8;
  undefined1 (*pauVar9) [32];
  int32_t *piVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  int xq [2];
  
  iVar2 = av1_selfguided_restoration_avx2
                    (dat8,width,height,stride,tmpbuf,tmpbuf + 0x27734,width,eps,bit_depth,highbd);
  if (iVar2 == 0) {
    av1_decode_xq(xqd,xq,av1_sgr_params + eps);
    auVar11._4_4_ = xq[0];
    auVar11._0_4_ = xq[0];
    auVar11._8_4_ = xq[0];
    auVar11._12_4_ = xq[0];
    auVar11._16_4_ = xq[0];
    auVar11._20_4_ = xq[0];
    auVar11._24_4_ = xq[0];
    auVar11._28_4_ = xq[0];
    auVar12._4_4_ = xq[1];
    auVar12._0_4_ = xq[1];
    auVar12._8_4_ = xq[1];
    auVar12._12_4_ = xq[1];
    auVar12._16_4_ = xq[1];
    auVar12._20_4_ = xq[1];
    auVar12._24_4_ = xq[1];
    auVar12._28_4_ = xq[1];
    auVar13._0_2_ = ~(ushort)(-1 << ((byte)bit_depth & 0x1f));
    auVar13._2_2_ = auVar13._0_2_;
    auVar13._4_2_ = auVar13._0_2_;
    auVar13._6_2_ = auVar13._0_2_;
    auVar13._8_2_ = auVar13._0_2_;
    auVar13._10_2_ = auVar13._0_2_;
    auVar13._12_2_ = auVar13._0_2_;
    auVar13._14_2_ = auVar13._0_2_;
    auVar13._16_2_ = auVar13._0_2_;
    auVar13._18_2_ = auVar13._0_2_;
    auVar13._20_2_ = auVar13._0_2_;
    auVar13._22_2_ = auVar13._0_2_;
    auVar13._24_2_ = auVar13._0_2_;
    auVar13._26_2_ = auVar13._0_2_;
    auVar13._28_2_ = auVar13._0_2_;
    auVar13._30_2_ = auVar13._0_2_;
    uVar6 = 0;
    uVar8 = (ulong)(uint)height;
    if (height < 1) {
      uVar8 = uVar6;
    }
    pauVar3 = (undefined1 (*) [16])((long)dat8 * 2);
    piVar10 = tmpbuf + 0x2773c;
    pauVar5 = (undefined1 (*) [32])((long)dst8 * 2);
    for (; uVar6 != uVar8; uVar6 = uVar6 + 1) {
      pauVar7 = pauVar3;
      pauVar9 = pauVar5;
      for (lVar4 = 0; lVar4 < width; lVar4 = lVar4 + 0x10) {
        if (highbd == 0) {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = *(ulong *)(dat8 + lVar4);
          auVar14 = vpmovzxbd_avx2(auVar1);
          auVar15._8_8_ = *(undefined8 *)(dat8 + lVar4 + 8);
          auVar15._0_8_ = *(undefined8 *)(dat8 + lVar4 + 8);
          auVar17 = vpmovzxbd_avx2(auVar15);
        }
        else {
          auVar14 = vpmovzxwd_avx2(*pauVar7);
          auVar17 = vpmovzxwd_avx2(pauVar7[1]);
        }
        auVar19 = vpslld_avx2(auVar14,4);
        auVar18 = vpslld_avx2(auVar17,4);
        auVar16 = vpslld_avx2(auVar14,0xb);
        auVar14 = vpslld_avx2(auVar17,0xb);
        if (0 < av1_sgr_params[eps].r[0]) {
          auVar17 = vpsubd_avx2(*(undefined1 (*) [32])(piVar10 + lVar4 + -0x2773c),auVar19);
          auVar17 = vpmulld_avx2(auVar17,auVar11);
          auVar16 = vpaddd_avx2(auVar17,auVar16);
          auVar17 = vpsubd_avx2(*(undefined1 (*) [32])(piVar10 + lVar4 + -0x27734),auVar18);
          auVar17 = vpmulld_avx2(auVar17,auVar11);
          auVar14 = vpaddd_avx2(auVar17,auVar14);
        }
        if (0 < av1_sgr_params[eps].r[1]) {
          auVar17 = vpsubd_avx2(*(undefined1 (*) [32])(piVar10 + lVar4 + -8),auVar19);
          auVar17 = vpmulld_avx2(auVar17,auVar12);
          auVar16 = vpaddd_avx2(auVar17,auVar16);
          auVar17 = vpsubd_avx2(*(undefined1 (*) [32])(piVar10 + lVar4),auVar18);
          auVar17 = vpmulld_avx2(auVar17,auVar12);
          auVar14 = vpaddd_avx2(auVar17,auVar14);
        }
        auVar18._8_4_ = 0x400;
        auVar18._0_8_ = 0x40000000400;
        auVar18._12_4_ = 0x400;
        auVar18._16_4_ = 0x400;
        auVar18._20_4_ = 0x400;
        auVar18._24_4_ = 0x400;
        auVar18._28_4_ = 0x400;
        auVar17 = vpaddd_avx2(auVar16,auVar18);
        auVar17 = vpsrad_avx2(auVar17,0xb);
        auVar14 = vpaddd_avx2(auVar14,auVar18);
        auVar14 = vpsrad_avx2(auVar14,0xb);
        if (highbd == 0) {
          auVar14 = vpackssdw_avx2(auVar17,auVar14);
          auVar1 = vpackuswb_avx(auVar14._0_16_,auVar14._16_16_);
          auVar1 = vpshufd_avx(auVar1,0xd8);
          *(undefined1 (*) [16])(dst8 + lVar4) = auVar1;
        }
        else {
          auVar14 = vpackusdw_avx2(auVar17,auVar14);
          auVar14 = vpermq_avx2(auVar14,0xd8);
          auVar14 = vpminsw_avx2(auVar14,auVar13);
          *pauVar9 = auVar14;
        }
        pauVar7 = pauVar7 + 2;
        pauVar9 = pauVar9 + 1;
      }
      dat8 = dat8 + stride;
      pauVar3 = (undefined1 (*) [16])(*pauVar3 + (long)stride * 2);
      piVar10 = piVar10 + width;
      pauVar5 = (undefined1 (*) [32])(*pauVar5 + (long)dst_stride * 2);
      dst8 = dst8 + dst_stride;
    }
    iVar2 = 0;
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int av1_apply_selfguided_restoration_avx2(const uint8_t *dat8, int width,
                                          int height, int stride, int eps,
                                          const int *xqd, uint8_t *dst8,
                                          int dst_stride, int32_t *tmpbuf,
                                          int bit_depth, int highbd) {
  int32_t *flt0 = tmpbuf;
  int32_t *flt1 = flt0 + RESTORATION_UNITPELS_MAX;
  assert(width * height <= RESTORATION_UNITPELS_MAX);
  const int ret = av1_selfguided_restoration_avx2(
      dat8, width, height, stride, flt0, flt1, width, eps, bit_depth, highbd);
  if (ret != 0) return ret;
  const sgr_params_type *const params = &av1_sgr_params[eps];
  int xq[2];
  av1_decode_xq(xqd, xq, params);

  __m256i xq0 = _mm256_set1_epi32(xq[0]);
  __m256i xq1 = _mm256_set1_epi32(xq[1]);

  for (int i = 0; i < height; ++i) {
    // Calculate output in batches of 16 pixels
    for (int j = 0; j < width; j += 16) {
      const int k = i * width + j;
      const int m = i * dst_stride + j;

      const uint8_t *dat8ij = dat8 + i * stride + j;
      __m256i ep_0, ep_1;
      __m128i src_0, src_1;
      if (highbd) {
        src_0 = xx_loadu_128(CONVERT_TO_SHORTPTR(dat8ij));
        src_1 = xx_loadu_128(CONVERT_TO_SHORTPTR(dat8ij + 8));
        ep_0 = _mm256_cvtepu16_epi32(src_0);
        ep_1 = _mm256_cvtepu16_epi32(src_1);
      } else {
        src_0 = xx_loadu_128(dat8ij);
        ep_0 = _mm256_cvtepu8_epi32(src_0);
        ep_1 = _mm256_cvtepu8_epi32(_mm_srli_si128(src_0, 8));
      }

      const __m256i u_0 = _mm256_slli_epi32(ep_0, SGRPROJ_RST_BITS);
      const __m256i u_1 = _mm256_slli_epi32(ep_1, SGRPROJ_RST_BITS);

      __m256i v_0 = _mm256_slli_epi32(u_0, SGRPROJ_PRJ_BITS);
      __m256i v_1 = _mm256_slli_epi32(u_1, SGRPROJ_PRJ_BITS);

      if (params->r[0] > 0) {
        const __m256i f1_0 = _mm256_sub_epi32(yy_loadu_256(&flt0[k]), u_0);
        v_0 = _mm256_add_epi32(v_0, _mm256_mullo_epi32(xq0, f1_0));

        const __m256i f1_1 = _mm256_sub_epi32(yy_loadu_256(&flt0[k + 8]), u_1);
        v_1 = _mm256_add_epi32(v_1, _mm256_mullo_epi32(xq0, f1_1));
      }

      if (params->r[1] > 0) {
        const __m256i f2_0 = _mm256_sub_epi32(yy_loadu_256(&flt1[k]), u_0);
        v_0 = _mm256_add_epi32(v_0, _mm256_mullo_epi32(xq1, f2_0));

        const __m256i f2_1 = _mm256_sub_epi32(yy_loadu_256(&flt1[k + 8]), u_1);
        v_1 = _mm256_add_epi32(v_1, _mm256_mullo_epi32(xq1, f2_1));
      }

      const __m256i rounding =
          round_for_shift(SGRPROJ_PRJ_BITS + SGRPROJ_RST_BITS);
      const __m256i w_0 = _mm256_srai_epi32(
          _mm256_add_epi32(v_0, rounding), SGRPROJ_PRJ_BITS + SGRPROJ_RST_BITS);
      const __m256i w_1 = _mm256_srai_epi32(
          _mm256_add_epi32(v_1, rounding), SGRPROJ_PRJ_BITS + SGRPROJ_RST_BITS);

      if (highbd) {
        // Pack into 16 bits and clamp to [0, 2^bit_depth)
        // Note that packing into 16 bits messes up the order of the bits,
        // so we use a permute function to correct this
        const __m256i tmp = _mm256_packus_epi32(w_0, w_1);
        const __m256i tmp2 = _mm256_permute4x64_epi64(tmp, 0xd8);
        const __m256i max = _mm256_set1_epi16((1 << bit_depth) - 1);
        const __m256i res = _mm256_min_epi16(tmp2, max);
        yy_storeu_256(CONVERT_TO_SHORTPTR(dst8 + m), res);
      } else {
        // Pack into 8 bits and clamp to [0, 256)
        // Note that each pack messes up the order of the bits,
        // so we use a permute function to correct this
        const __m256i tmp = _mm256_packs_epi32(w_0, w_1);
        const __m256i tmp2 = _mm256_permute4x64_epi64(tmp, 0xd8);
        const __m256i res =
            _mm256_packus_epi16(tmp2, tmp2 /* "don't care" value */);
        const __m128i res2 =
            _mm256_castsi256_si128(_mm256_permute4x64_epi64(res, 0xd8));
        xx_storeu_128(dst8 + m, res2);
      }
    }
  }
  return 0;
}